

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O2

int Io_WriteBench(Abc_Ntk_t *pNtk,char *pFileName)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  ProgressBar *p;
  char *pString;
  size_t __size;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_NETLIST)) {
    iVar2 = Io_WriteBenchCheckNames(pNtk);
    if (iVar2 == 0) {
      pcVar6 = 
      "Io_WriteBench(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
      ;
      __size = 0x90;
    }
    else {
      __stream = fopen(pFileName,"w");
      if (__stream != (FILE *)0x0) {
        pcVar6 = pNtk->pName;
        pcVar4 = Extra_TimeStamp();
        fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar6,pcVar4);
        for (iVar2 = 0; iVar2 < pNtk->vPis->nSize; iVar2 = iVar2 + 1) {
          pAVar5 = Abc_NtkPi(pNtk,iVar2);
          pcVar6 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray])
          ;
          fprintf(__stream,"INPUT(%s)\n",pcVar6);
        }
        for (iVar2 = 0; iVar2 < pNtk->vPos->nSize; iVar2 = iVar2 + 1) {
          pAVar5 = Abc_NtkPo(pNtk,iVar2);
          pcVar6 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
          fprintf(__stream,"OUTPUT(%s)\n",pcVar6);
        }
        for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
          pAVar5 = Abc_NtkBox(pNtk,iVar2);
          if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
            plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
            pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[6] * 8));
            plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
            pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            fprintf(__stream,"%-11s = DFF(%s)\n",pcVar6,pcVar4);
          }
        }
        p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
        iVar2 = 0;
        do {
          if (pNtk->vObjs->nSize <= iVar2) {
            Extra_ProgressBarStop(p);
            if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
              puts("Io_WriteBench: EXDC is not written (warning).");
            }
            fclose(__stream);
            return 1;
          }
          pAVar5 = Abc_NtkObj(pNtk,iVar2);
          if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
            Extra_ProgressBarUpdate(p,iVar2,pString);
            if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 7) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                            ,0x86,"int Io_WriteBenchOneNode(FILE *, Abc_Obj_t *)");
            }
            iVar3 = (pAVar5->vFanins).nSize;
            if (iVar3 == 1) {
              iVar3 = Abc_NodeIsBuf(pAVar5);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
              if (iVar3 == 0) {
                pcVar4 = "%-11s = NOT(";
              }
              else {
                pcVar4 = "%-11s = BUFF(";
              }
              fprintf(__stream,pcVar4,pcVar6);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
              fprintf(__stream,"%s)\n",pcVar6);
            }
            else if (iVar3 == 0) {
              iVar3 = Abc_NodeIsConst1(pAVar5);
              if (iVar3 == 0) {
                __assert_fail("Abc_NodeIsConst1(pNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                              ,0x8a,"int Io_WriteBenchOneNode(FILE *, Abc_Obj_t *)");
              }
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
              fprintf(__stream,"%-11s",pcVar6);
              fwrite(" = vdd\n",7,1,__stream);
            }
            else {
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
              fprintf(__stream,"%-11s",pcVar6);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
              fprintf(__stream," = AND(%s, ",pcVar6);
              pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[1]]);
              fprintf(__stream,"%s)\n",pcVar6);
            }
          }
          iVar2 = iVar2 + 1;
        } while( true );
      }
      pcVar6 = "Io_WriteBench(): Cannot open the output file.\n";
      __size = 0x2e;
    }
    fwrite(pcVar6,__size,1,_stdout);
    return 0;
  }
  __assert_fail("Abc_NtkIsSopNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                ,0x39,"int Io_WriteBench(Abc_Ntk_t *, const char *)");
}

Assistant:

int Io_WriteBench( Abc_Ntk_t * pNtk, const char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsSopNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBench(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}